

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketpair.c
# Opt level: O0

int Curl_socketpair(int domain,int type,int protocol,curl_socket_t *socks)

{
  int __fd;
  int iVar1;
  pollfd local_54;
  pollfd pfd [1];
  int reuse;
  curl_socklen_t addrlen;
  curl_socket_t listener;
  anon_union_16_2_022c54a6 a2;
  anon_union_16_2_022c54a6 a;
  curl_socket_t *socks_local;
  int protocol_local;
  int type_local;
  int domain_local;
  
  pfd[0].events = 0x10;
  pfd[0].revents = 0;
  pfd[0].fd = 1;
  a.inaddr.sin_zero = (uchar  [8])socks;
  socks_local._0_4_ = protocol;
  socks_local._4_4_ = type;
  protocol_local = domain;
  __fd = socket(2,1,6);
  if (__fd != -1) {
    memset(a2.inaddr.sin_zero,0,0x10);
    a2._8_2_ = 2;
    a2._12_4_ = htonl(0x7f000001);
    a2._10_2_ = 0;
    *(undefined4 *)((long)a.inaddr.sin_zero + 4) = 0xffffffff;
    *(undefined4 *)a.inaddr.sin_zero = 0xffffffff;
    iVar1 = setsockopt(__fd,1,2,pfd,4);
    if ((((iVar1 != -1) && (iVar1 = bind(__fd,(sockaddr *)a2.inaddr.sin_zero,0x10), iVar1 != -1)) &&
        (iVar1 = getsockname(__fd,(sockaddr *)a2.inaddr.sin_zero,(socklen_t *)&pfd[0].events),
        iVar1 != -1)) && ((0xf < (uint)pfd[0]._4_4_ && (iVar1 = listen(__fd,1), iVar1 != -1)))) {
      iVar1 = socket(2,1,0);
      *(int *)a.inaddr.sin_zero = iVar1;
      if ((*(int *)a.inaddr.sin_zero != -1) &&
         ((iVar1 = connect(*(int *)a.inaddr.sin_zero,(sockaddr *)a2.inaddr.sin_zero,0x10),
          iVar1 != -1 && (iVar1 = curlx_nonblock(__fd,1), -1 < iVar1)))) {
        local_54.events = 1;
        local_54.revents = 0;
        local_54.fd = __fd;
        Curl_poll(&local_54,1,10000);
        iVar1 = accept(__fd,(sockaddr *)0x0,(socklen_t *)0x0);
        *(int *)((long)a.inaddr.sin_zero + 4) = iVar1;
        if (*(int *)((long)a.inaddr.sin_zero + 4) != -1) {
          pfd[0].events = 0x10;
          pfd[0].revents = 0;
          iVar1 = getsockname(*(int *)a.inaddr.sin_zero,(sockaddr *)a2.inaddr.sin_zero,
                              (socklen_t *)&pfd[0].events);
          if ((iVar1 != -1) && (0xf < (uint)pfd[0]._4_4_)) {
            pfd[0].events = 0x10;
            pfd[0].revents = 0;
            iVar1 = getpeername(*(int *)((long)a.inaddr.sin_zero + 4),(sockaddr *)&addrlen,
                                (socklen_t *)&pfd[0].events);
            if (((iVar1 != -1) &&
                (((0xf < (uint)pfd[0]._4_4_ && (a2._8_2_ == (short)addrlen)) &&
                 (a2._12_4_ == listener)))) && (a2._10_2_ == addrlen._2_2_)) {
              close(__fd);
              return 0;
            }
          }
        }
      }
    }
    close(__fd);
    close(*(int *)a.inaddr.sin_zero);
    close(*(int *)((long)a.inaddr.sin_zero + 4));
  }
  return -1;
}

Assistant:

int Curl_socketpair(int domain, int type, int protocol,
                    curl_socket_t socks[2])
{
  union {
    struct sockaddr_in inaddr;
    struct sockaddr addr;
  } a, a2;
  curl_socket_t listener;
  curl_socklen_t addrlen = sizeof(a.inaddr);
  int reuse = 1;
  struct pollfd pfd[1];
  (void)domain;
  (void)type;
  (void)protocol;

  listener = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
  if(listener == CURL_SOCKET_BAD)
    return -1;

  memset(&a, 0, sizeof(a));
  a.inaddr.sin_family = AF_INET;
  a.inaddr.sin_addr.s_addr = htonl(INADDR_LOOPBACK);
  a.inaddr.sin_port = 0;

  socks[0] = socks[1] = CURL_SOCKET_BAD;

  if(setsockopt(listener, SOL_SOCKET, SO_REUSEADDR,
                (char *)&reuse, (curl_socklen_t)sizeof(reuse)) == -1)
    goto error;
  if(bind(listener, &a.addr, sizeof(a.inaddr)) == -1)
    goto error;
  if(getsockname(listener, &a.addr, &addrlen) == -1 ||
     addrlen < (int)sizeof(a.inaddr))
    goto error;
  if(listen(listener, 1) == -1)
    goto error;
  socks[0] = socket(AF_INET, SOCK_STREAM, 0);
  if(socks[0] == CURL_SOCKET_BAD)
    goto error;
  if(connect(socks[0], &a.addr, sizeof(a.inaddr)) == -1)
    goto error;

  /* use non-blocking accept to make sure we don't block forever */
  if(curlx_nonblock(listener, TRUE) < 0)
    goto error;
  pfd[0].fd = listener;
  pfd[0].events = POLLIN;
  pfd[0].revents = 0;
  (void)Curl_poll(pfd, 1, 10*1000); /* 10 seconds */
  socks[1] = accept(listener, NULL, NULL);
  if(socks[1] == CURL_SOCKET_BAD)
    goto error;

  /* verify that nothing else connected */
  addrlen = sizeof(a.inaddr);
  if(getsockname(socks[0], &a.addr, &addrlen) == -1 ||
     addrlen < (int)sizeof(a.inaddr))
    goto error;
  addrlen = sizeof(a2.inaddr);
  if(getpeername(socks[1], &a2.addr, &addrlen) == -1 ||
     addrlen < (int)sizeof(a2.inaddr))
    goto error;
  if(a.inaddr.sin_family != a2.inaddr.sin_family ||
     a.inaddr.sin_addr.s_addr != a2.inaddr.sin_addr.s_addr ||
     a.inaddr.sin_port != a2.inaddr.sin_port)
    goto error;

  sclose(listener);
  return 0;

  error:
  sclose(listener);
  sclose(socks[0]);
  sclose(socks[1]);
  return -1;
}